

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<double>::Decompose_LDLt
          (TPZSkylMatrix<double> *this,list<long,_std::allocator<long>_> *singular)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  int64_t iVar3;
  double **ppdVar4;
  value_type_conflict5 *__x;
  long lVar5;
  undefined8 in_RSI;
  TPZBaseMatrix *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  double a;
  int64_t k;
  double sum;
  int64_t dimension;
  int64_t minrow;
  int64_t minl;
  int64_t minj;
  int64_t l;
  int64_t j;
  double *ell;
  double *elj;
  char *in_stack_00000148;
  char *in_stack_00000150;
  list<long,_std::allocator<long>_> *in_stack_ffffffffffffff50;
  value_type_conflict5 *in_stack_ffffffffffffff58;
  TPZSkylMatrix<double> *in_stack_ffffffffffffff60;
  long local_98;
  undefined8 local_78;
  long local_70;
  long local_68;
  double local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  double *local_28;
  double *local_20;
  undefined8 local_18;
  
  if (in_RDI->fDecomposed != '\x04') {
    local_18 = in_RSI;
    if (in_RDI->fDecomposed != '\0') {
      TPZMatrix<double>::Error(in_stack_00000150,in_stack_00000148);
    }
    std::__cxx11::list<long,_std::allocator<long>_>::clear(in_stack_ffffffffffffff50);
    iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_58 = CONCAT44(extraout_var,iVar2);
    for (local_30 = 1; lVar5 = local_30, local_30 < local_58; local_30 = local_30 + 1) {
      iVar3 = Size(in_stack_ffffffffffffff60,(int64_t)in_stack_ffffffffffffff58);
      local_40 = (lVar5 - iVar3) + 1;
      for (local_38 = local_40; lVar5 = local_38, local_38 <= local_30; local_38 = local_38 + 1) {
        iVar3 = Size(in_stack_ffffffffffffff60,(int64_t)in_stack_ffffffffffffff58);
        local_48 = (lVar5 - iVar3) + 1;
        local_98 = local_48;
        if (local_48 <= local_40) {
          local_98 = local_40;
        }
        local_50 = local_98;
        local_68 = local_98;
        ppdVar4 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),local_30);
        local_20 = *ppdVar4 + (local_30 - local_50);
        ppdVar4 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),local_38);
        local_28 = *ppdVar4 + (local_38 - local_50);
        local_60 = 0.0;
        while (lVar5 = local_68, local_68 < local_38) {
          in_stack_ffffffffffffff60 = (TPZSkylMatrix<double> *)(*local_20 * *local_28);
          local_68 = local_68 + 1;
          local_28 = local_28 + -1;
          local_20 = local_20 + -1;
          ppdVar4 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),lVar5);
          local_60 = (double)in_stack_ffffffffffffff60 * **ppdVar4 + local_60;
        }
        *local_20 = *local_20 - local_60;
        if (local_28 == local_20) {
          bVar1 = IsZero(*local_20);
          if (bVar1) {
            std::__cxx11::list<long,_std::allocator<long>_>::push_back
                      ((list<long,_std::allocator<long>_> *)in_stack_ffffffffffffff60,
                       in_stack_ffffffffffffff58);
            *local_20 = 1.0;
          }
        }
        else {
          *local_20 = *local_20 / *local_28;
        }
      }
    }
    iVar3 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar3 != 0) {
      iVar3 = TPZBaseMatrix::Rows(in_RDI);
      __x = (value_type_conflict5 *)(iVar3 + -1);
      iVar3 = TPZBaseMatrix::Rows(in_RDI);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,__x,iVar3 + -1);
      bVar1 = IsZero(a);
      if (bVar1) {
        iVar3 = TPZBaseMatrix::Rows(in_RDI);
        local_70 = iVar3 + -1;
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  ((list<long,_std::allocator<long>_> *)in_stack_ffffffffffffff60,__x);
        iVar3 = TPZBaseMatrix::Rows(in_RDI);
        lVar5 = iVar3 + -1;
        iVar3 = TPZBaseMatrix::Rows(in_RDI);
        local_78 = 0x3ff0000000000000;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,lVar5,iVar3 + -1,&local_78,in_R8,in_R9,local_18);
      }
    }
    in_RDI->fDecomposed = '\x04';
    in_RDI->fDefPositive = '\0';
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_LDLt(std::list<int64_t> &singular)
{
    if( this->fDecomposed == ELDLt) return 1;
    if ( this->fDecomposed )
    {
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_LDLt <Matrix already Decomposed with different decomposition>" );
    }
    
#ifdef DUMP_BEFORE_DECOMPOSE
    dump_matrix(this, "TPZSkylMatrix::Decompose_LDLt(singular)");
#endif
    
    singular.clear();
    
    // Third try
    TVar *elj,*ell;
    int64_t j,l,minj,minl,minrow,dimension = this->Dim();
    TVar sum;
    j = 1;
    while(j < dimension) {
        minj = j-Size(j)+1;
        l = minj;
        while(l <= j) {
            minl = l-Size(l)+1;
            minrow = (minj<minl)? minl:minj;
            int64_t k = minrow;
            //			DiagkPtr = fDiag+minrow;
            elj = fElem[j]+j-minrow;
            ell = fElem[l]+l-minrow;
            sum = 0.;
            //EBORIN: 
            // Is this a hot spot?
            while(k < l) {
                sum += *elj-- * *ell-- * *(fElem[k++]);
            }
            *elj -= sum;
            if(ell != elj) *elj /= *ell;
            else if(IsZero(*elj)) {
                singular.push_back(l);
                *elj = 1.;
            }
            l++;
        }
        j++;
    }
    
    if(this->Rows() && IsZero(GetVal(this->Rows()-1,this->Rows()-1)))
    {
        singular.push_back(this->Rows()-1);
        PutVal(this->Rows()-1,this->Rows()-1,1.);
    }
    this->fDecomposed  = ELDLt;
    this->fDefPositive = 0;
    //if(Dim() > 100) cout << endl;
    return( 1 );
}